

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonmodelserialiser.cpp
# Opt level: O2

bool __thiscall
JsonModelSerialiserPrivate::roleForObject
          (JsonModelSerialiserPrivate *this,QJsonObject *source,QModelIndex *destination)

{
  QAbstractItemModel *pQVar1;
  bool bVar2;
  undefined1 uVar3;
  undefined4 uVar4;
  int type;
  QLatin1String QVar5;
  QLatin1String QVar6;
  QLatin1String QVar7;
  QJsonValue tempValue;
  QVariant local_68;
  QArrayDataPointer<char16_t> local_48;
  
  QVar5.m_data = (char *)source;
  QVar5.m_size = (qsizetype)&tempValue;
  QJsonObject::value(QVar5);
  bVar2 = QJsonValue::isUndefined(&tempValue);
  if (!bVar2) {
    bVar2 = QJsonValue::isDouble(&tempValue);
    if (bVar2) {
      uVar4 = QJsonValue::toInt((int)&tempValue);
      QVar6.m_data = (char *)source;
      QVar6.m_size = (qsizetype)&local_68;
      QJsonObject::value(QVar6);
      QJsonValue::swap(&tempValue);
      QJsonValue::~QJsonValue((QJsonValue *)&local_68);
      bVar2 = QJsonValue::isUndefined(&tempValue);
      if (!bVar2) {
        bVar2 = QJsonValue::isDouble(&tempValue);
        if (bVar2) {
          type = QJsonValue::toInt((int)&tempValue);
          QVar7.m_data = (char *)source;
          QVar7.m_size = (qsizetype)&local_68;
          QJsonObject::value(QVar7);
          QJsonValue::swap(&tempValue);
          QJsonValue::~QJsonValue((QJsonValue *)&local_68);
          bVar2 = QJsonValue::isUndefined(&tempValue);
          if (!bVar2) {
            bVar2 = QJsonValue::isString(&tempValue);
            if (bVar2) {
              pQVar1 = (this->super_AbstractStringSerialiserPrivate).
                       super_AbstractModelSerialiserPrivate.m_model;
              QJsonValue::toString();
              AbstractStringSerialiserPrivate::loadVariant
                        (&local_68,&this->super_AbstractStringSerialiserPrivate,type,
                         (QString *)&local_48);
              uVar3 = (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,destination,&local_68,uVar4);
              ::QVariant::~QVariant(&local_68);
              QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
              goto LAB_00128909;
            }
          }
        }
      }
    }
  }
  uVar3 = 0;
LAB_00128909:
  QJsonValue::~QJsonValue(&tempValue);
  return (bool)uVar3;
}

Assistant:

bool JsonModelSerialiserPrivate::roleForObject(const QJsonObject &source, const QModelIndex &destination)
{
    QJsonValue tempValue = source.value(QLatin1String("role"));
    if (tempValue.isUndefined() || !tempValue.isDouble())
        return false;
    const int tempRole =
#if (QT_VERSION >= QT_VERSION_CHECK(5, 2, 0))
            tempValue.toInt();
#else
            static_cast<int>(tempValue.toDouble());
#endif
    tempValue = source.value(QLatin1String("type"));
    if (tempValue.isUndefined() || !tempValue.isDouble())
        return false;
    const int tempType =
#if (QT_VERSION >= QT_VERSION_CHECK(5, 2, 0))
            tempValue.toInt();
#else
            static_cast<int>(tempValue.toDouble());
#endif
    tempValue = source.value(QLatin1String("value"));
    if (tempValue.isUndefined() || !tempValue.isString())
        return false;
    if (!m_model->setData(destination, loadVariant(tempType, tempValue.toString()), tempRole))
        return false;
    return true;
}